

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O1

void __thiscall TCPConnection::Write(TCPConnection *this,uint8_t *data,uint16_t length)

{
  uint16_t *puVar1;
  uint8_t uVar2;
  ushort uVar3;
  uint8_t *puVar4;
  ushort uVar5;
  DataBuffer *pDVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined6 in_register_00000012;
  ushort uVar10;
  
  if ((int)CONCAT62(in_register_00000012,length) != 0) {
    uVar9 = CONCAT62(in_register_00000012,length) & 0xffffffff;
    do {
      if (this->TxBuffer == (DataBuffer *)0x0) {
        pDVar6 = GetTxBuffer(this);
        this->TxBuffer = pDVar6;
        this->TxOffset = 0;
      }
      if (this->TxBuffer == (DataBuffer *)0x0) {
        puts("Out of tx buffers");
      }
      else {
        uVar10 = (ushort)uVar9;
        if (uVar10 < this->TxBuffer->Remainder) {
          uVar5 = 1;
          if (1 < uVar10) {
            uVar5 = uVar10;
          }
          uVar9 = 0;
          do {
            uVar2 = data[uVar9];
            puVar4 = this->TxBuffer->Packet;
            uVar3 = this->TxOffset;
            this->TxOffset = uVar3 + 1;
            puVar4[uVar3] = uVar2;
            uVar9 = uVar9 + 1;
          } while (uVar5 != uVar9);
          pDVar6 = this->TxBuffer;
          puVar1 = &pDVar6->Length;
          *puVar1 = *puVar1 + uVar10;
          puVar1 = &pDVar6->Remainder;
          *puVar1 = *puVar1 - uVar10;
          return;
        }
        pDVar6 = this->TxBuffer;
        uVar7 = (ulong)pDVar6->Remainder;
        if (pDVar6->Remainder != 0) {
          uVar8 = 0;
          do {
            uVar2 = data[uVar8];
            puVar4 = pDVar6->Packet;
            uVar10 = this->TxOffset;
            this->TxOffset = uVar10 + 1;
            puVar4[uVar10] = uVar2;
            uVar8 = uVar8 + 1;
            pDVar6 = this->TxBuffer;
            uVar7 = (ulong)pDVar6->Remainder;
          } while (uVar8 < uVar7);
        }
        pDVar6->Length = pDVar6->Length + (short)uVar7;
        uVar9 = (ulong)(uint)((int)uVar9 - (int)uVar7);
        data = data + uVar7;
        pDVar6->Remainder = 0;
        if (pDVar6 != (DataBuffer *)0x0) {
          BuildPacket(this,pDVar6,'\b');
          this->TxBuffer = (DataBuffer *)0x0;
        }
      }
    } while ((short)uVar9 != 0);
  }
  return;
}

Assistant:

void TCPConnection::Write(const uint8_t* data, uint16_t length)
{
    uint16_t i;

    while (length > 0)
    {
        if (!TxBuffer)
        {
            TxBuffer = GetTxBuffer();
            TxOffset = 0;
        }

        if (TxBuffer)
        {
            if (TxBuffer->Remainder > length)
            {
                for (i = 0; i < length; i++)
                {
                    TxBuffer->Packet[TxOffset++] = data[i];
                }
                TxBuffer->Length += length;
                TxBuffer->Remainder -= length;
                break;
            }
            else if (TxBuffer->Remainder <= length)
            {
                for (i = 0; i < TxBuffer->Remainder; i++)
                {
                    TxBuffer->Packet[TxOffset++] = data[i];
                }
                TxBuffer->Length += TxBuffer->Remainder;
                length -= TxBuffer->Remainder;
                data += TxBuffer->Remainder;
                TxBuffer->Remainder = 0;
                Flush();
            }
        }
        else
        {
            printf("Out of tx buffers\n");
        }
    }
}